

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_ea566c::AddressDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,AddressDescriptor *this
          ,vector<CPubKey,_std::allocator<CPubKey>_> *param_1,Span<const_CScript> param_2,
          FlatSigningProvider *param_3)

{
  long in_FS_OFFSET;
  prevector<28U,_unsigned_char,_unsigned_int,_int> pStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&pStack_38,&this->m_destination);
  Vector<CScript>(__return_storage_ptr__,(CScript *)&pStack_38);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&pStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript>, FlatSigningProvider&) const override { return Vector(GetScriptForDestination(m_destination)); }